

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O3

cse_abstract * __thiscall
factory_item<xray_re::cse_alife_helicopter>::create
          (factory_item<xray_re::cse_alife_helicopter> *this)

{
  cse_alife_object *this_00;
  
  this_00 = (cse_alife_object *)operator_new(0x1e0);
  xray_re::cse_alife_object::cse_alife_object(this_00);
  (this_00->super_cse_abstract)._vptr_cse_abstract = (_func_int **)&PTR__cse_abstract_00247d50;
  xray_re::cse_visual::cse_visual((cse_visual *)(this_00 + 1));
  (this_00->super_cse_abstract)._vptr_cse_abstract =
       (_func_int **)&PTR__cse_alife_dynamic_object_visual_00247dd0;
  this_00[1].super_cse_abstract._vptr_cse_abstract =
       (_func_int **)&PTR__cse_alife_dynamic_object_visual_00247e38;
  xray_re::cse_motion::cse_motion
            ((cse_motion *)((long)&this_00[1].super_cse_abstract.m_s_name.field_2 + 8));
  xray_re::cse_ph_skeleton::cse_ph_skeleton
            ((cse_ph_skeleton *)&this_00[1].super_cse_abstract.m_ini_string);
  (this_00->super_cse_abstract)._vptr_cse_abstract =
       (_func_int **)&PTR__cse_alife_helicopter_00248260;
  this_00[1].super_cse_abstract._vptr_cse_abstract =
       (_func_int **)&PTR__cse_alife_helicopter_002482c8;
  *(undefined ***)((long)&this_00[1].super_cse_abstract.m_s_name.field_2 + 8) =
       &PTR__cse_alife_helicopter_002482f0;
  this_00[1].super_cse_abstract.m_ini_string._M_dataplus._M_p =
       (pointer)&PTR__cse_alife_helicopter_00248318;
  this_00[1].super_cse_abstract.m_markers.c.
  super__Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &this_00[1].super_cse_abstract.m_markers.c.
        super__Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  this_00[1].super_cse_abstract.m_markers.c.
  super__Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  *(undefined1 *)
   &this_00[1].super_cse_abstract.m_markers.c.
    super__Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>
    ._M_impl.super__Deque_impl_data._M_start._M_cur = 0;
  (this_00->super_cse_abstract).m_clsid.field_0 = (this->super_factory_item_base).m_clsid.field_0;
  return &this_00->super_cse_abstract;
}

Assistant:

cse_abstract* factory_item<T>::create()
{
	T* p = new T;
	p->clsid() = clsid();
	return p;
}